

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::on_text(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *this,char *begin,char *end)

{
  checked_ptr<typename_buffer<char>::value_type> __dest;
  ptrdiff_t _Num;
  iterator out;
  back_insert_iterator<fmt::v6::internal::buffer<char>_> local_20;
  
  local_20.container = (this->context).out_.container;
  __dest = internal::reserve<fmt::v6::internal::buffer<char>,_0>(&local_20,(long)end - (long)begin);
  if ((long)end - (long)begin != 0) {
    memmove(__dest,begin,(long)end - (long)begin);
  }
  (this->context).out_.container = local_20.container;
  return;
}

Assistant:

void on_text(const Char* begin, const Char* end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto&& it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }